

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

wchar_t format_numeric_keypad_key(char *buf,Terminal *term,char key,_Bool shift,_Bool ctrl)

{
  wchar_t wVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *__format;
  byte bVar6;
  byte bVar7;
  
  if (term->app_keypad_keys == true) {
    bVar6 = term->no_applic_k ^ 1;
  }
  else {
    bVar6 = 0;
  }
  iVar5 = (int)buf;
  if (((byte)(key - 0x31U) < 9) && (term->nethack_keypad != false)) {
    uVar2 = (byte)key - 0x31;
    bVar6 = "bjnh.lyku"[uVar2];
    bVar7 = bVar6 - 0x20;
    if (!shift) {
      bVar7 = bVar6;
    }
    if (uVar2 == 4) {
      bVar7 = bVar6;
    }
    bVar6 = bVar6 & 0x1f;
    if (!ctrl) {
      bVar6 = bVar7;
    }
    if (uVar2 == 4) {
      bVar6 = bVar7;
    }
    *buf = bVar6;
    iVar3 = iVar5 + 1;
    goto LAB_0010fc45;
  }
  wVar1 = term->funky_type;
  uVar2 = 0;
  iVar3 = (int)key;
  if ((wVar1 == L'\x03') || ((wVar1 < L'\x02' & bVar6) != 0)) {
    if (iVar3 < 0x2f) {
      if (iVar3 == 0x2a) {
        uVar2 = 0x52;
      }
      else if (iVar3 == 0x2d) {
        uVar2 = 0x53;
      }
    }
    else if (iVar3 == 0x2f) {
      uVar2 = 0x51;
    }
    else if (iVar3 == 0x47) {
      uVar2 = 0x50;
    }
  }
  if (bVar6 == 0) goto switchD_0010fb3e_caseD_2c;
  switch(iVar3) {
  case 0x2a:
    uVar4 = 0x6a;
    goto LAB_0010fbc3;
  case 0x2b:
    if (wVar1 == L'\x02') {
      uVar2 = shift + 0x6b;
    }
    else {
      uVar2 = shift | 0x6c;
    }
    break;
  case 0x2c:
    break;
  case 0x2d:
    uVar4 = 0x6d;
    goto LAB_0010fbc3;
  case 0x2e:
    uVar2 = 0x6e;
    break;
  case 0x2f:
    uVar4 = 0x6f;
LAB_0010fbc3:
    if (wVar1 == L'\x02') {
      uVar2 = uVar4;
    }
    break;
  case 0x30:
    uVar2 = 0x70;
    break;
  case 0x31:
    uVar2 = 0x71;
    break;
  case 0x32:
    uVar2 = 0x72;
    break;
  case 0x33:
    uVar2 = 0x73;
    break;
  case 0x34:
    uVar2 = 0x74;
    break;
  case 0x35:
    uVar2 = 0x75;
    break;
  case 0x36:
    uVar2 = 0x76;
    break;
  case 0x37:
    uVar2 = 0x77;
    break;
  case 0x38:
    uVar2 = 0x78;
    break;
  case 0x39:
    uVar2 = 0x79;
    break;
  default:
    if (iVar3 == 0xd) {
      uVar2 = 0x4d;
    }
  }
switchD_0010fb3e_caseD_2c:
  iVar3 = iVar5;
  if (uVar2 != 0) {
    if (term->vt52_mode == true) {
      if ((uVar2 & 0xfffffffc) == 0x50) {
        __format = "\x1b%c";
      }
      else {
        __format = "\x1b?%c";
      }
    }
    else {
      __format = "\x1bO%c";
    }
    iVar3 = sprintf(buf,__format);
    iVar3 = iVar3 + iVar5;
  }
LAB_0010fc45:
  return iVar3 - iVar5;
}

Assistant:

int format_numeric_keypad_key(char *buf, Terminal *term, char key,
                              bool shift, bool ctrl)
{
    char *p = buf;
    bool app_keypad = (term->app_keypad_keys && !term->no_applic_k);

    if (term->nethack_keypad && (key >= '1' && key <= '9')) {
        static const char nh_base[] = "bjnh.lyku";
        char c = nh_base[key - '1'];
        if (ctrl && c != '.')
            c &= 0x1F;
        else if (shift && c != '.')
            c += 'A'-'a';
        *p++ = c;
    } else {
        int xkey = 0;

        if (term->funky_type == FUNKY_VT400 ||
            (term->funky_type <= FUNKY_LINUX && app_keypad)) {
            switch (key) {
              case 'G': xkey = 'P'; break;
              case '/': xkey = 'Q'; break;
              case '*': xkey = 'R'; break;
              case '-': xkey = 'S'; break;
            }
        }

        if (app_keypad) {
            switch (key) {
              case '0': xkey = 'p'; break;
              case '1': xkey = 'q'; break;
              case '2': xkey = 'r'; break;
              case '3': xkey = 's'; break;
              case '4': xkey = 't'; break;
              case '5': xkey = 'u'; break;
              case '6': xkey = 'v'; break;
              case '7': xkey = 'w'; break;
              case '8': xkey = 'x'; break;
              case '9': xkey = 'y'; break;
              case '.': xkey = 'n'; break;
              case '\r': xkey = 'M'; break;

              case '+':
                /*
                 * Keypad + is tricky. It covers a space that would
                 * be taken up on the VT100 by _two_ keys; so we
                 * let Shift select between the two. Worse still,
                 * in xterm function key mode we change which two...
                 */
                if (term->funky_type == FUNKY_XTERM)
                    xkey = shift ? 'l' : 'k';
                else
                    xkey = shift ? 'm' : 'l';
                break;

              case '/':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'o';
                break;
              case '*':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'j';
                break;
              case '-':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'm';
                break;
            }
        }

        if (xkey) {
            if (term->vt52_mode) {
                if (xkey >= 'P' && xkey <= 'S')
                    p += sprintf(p, "\x1B%c", xkey);
                else
                    p += sprintf(p, "\x1B?%c", xkey);
            } else
                p += sprintf(p, "\x1BO%c", xkey);
        }
    }

    return p - buf;
}